

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O0

uint LodePNGText_copy(LodePNGInfo *dest,LodePNGInfo *source)

{
  uint uVar1;
  size_t sStack_28;
  uint error;
  size_t i;
  LodePNGInfo *source_local;
  LodePNGInfo *dest_local;
  
  dest->text_keys = (char **)0x0;
  dest->text_strings = (char **)0x0;
  dest->text_num = 0;
  sStack_28 = 0;
  while( true ) {
    if (sStack_28 == source->text_num) {
      return 0;
    }
    uVar1 = lodepng_add_text(dest,source->text_keys[sStack_28],source->text_strings[sStack_28]);
    if (uVar1 != 0) break;
    sStack_28 = sStack_28 + 1;
  }
  return uVar1;
}

Assistant:

static unsigned LodePNGText_copy(LodePNGInfo* dest, const LodePNGInfo* source) {
  size_t i = 0;
  dest->text_keys = 0;
  dest->text_strings = 0;
  dest->text_num = 0;
  for(i = 0; i != source->text_num; ++i) {
    CERROR_TRY_RETURN(lodepng_add_text(dest, source->text_keys[i], source->text_strings[i]));
  }
  return 0;
}